

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O2

void it_send_midi(DUMB_IT_SIGRENDERER *sigrenderer,IT_CHANNEL *channel,uchar midi_byte)

{
  char *pcVar1;
  _func_int_void_ptr_int_uchar *p_Var2;
  uchar uVar3;
  int iVar4;
  long lVar5;
  
  p_Var2 = sigrenderer->callbacks->midi;
  if ((p_Var2 != (_func_int_void_ptr_int_uchar *)0x0) &&
     (iVar4 = (*p_Var2)(sigrenderer->callbacks->midi_data,
                        (int)(((long)channel + (-0x20 - (long)sigrenderer)) / 0xa0),midi_byte),
     iVar4 != 0)) {
    return;
  }
  uVar3 = channel->midi_state;
  if (uVar3 == '\x02') {
    uVar3 = '\x03';
    if (midi_byte != '\0') {
      uVar3 = (midi_byte == '\x01') << 2;
    }
  }
  else {
    if (uVar3 == '\x03') {
      if (-1 < (char)midi_byte) {
        channel->filter_cutoff = midi_byte;
      }
    }
    else if (uVar3 == '\x04') {
      if (-1 < (char)midi_byte) {
        channel->filter_resonance = midi_byte;
      }
    }
    else if (((midi_byte == 0xff) || (midi_byte == 0xfa)) || (midi_byte == 0xfc)) {
      for (lVar5 = 0x32; lVar5 != 0x2832; lVar5 = lVar5 + 0xa0) {
        pcVar1 = sigrenderer->channel[0].arpeggio_offsets + lVar5 + -0x51;
        pcVar1[0] = '\x7f';
        pcVar1[1] = '\0';
      }
    }
    else if (midi_byte == 0xf0) {
      uVar3 = uVar3 + '\x01';
      goto LAB_00585ca9;
    }
    uVar3 = '\0';
  }
LAB_00585ca9:
  channel->midi_state = uVar3;
  return;
}

Assistant:

static void it_send_midi(DUMB_IT_SIGRENDERER *sigrenderer, IT_CHANNEL *channel, unsigned char midi_byte)
{
	if (sigrenderer->callbacks->midi)
		if ((*sigrenderer->callbacks->midi)(sigrenderer->callbacks->midi_data, (int)(channel - sigrenderer->channel), midi_byte))
			return;

	switch (channel->midi_state) {
		case 4: /* Ready to receive resonance parameter */
			if (midi_byte < 0x80) channel->filter_resonance = midi_byte;
			channel->midi_state = 0;
			break;
		case 3: /* Ready to receive cutoff parameter */
			if (midi_byte < 0x80) channel->filter_cutoff = midi_byte;
			channel->midi_state = 0;
			break;
		case 2: /* Ready for byte specifying which parameter will follow */
			if (midi_byte == 0) /* Cutoff */
				channel->midi_state = 3;
			else if (midi_byte == 1) /* Resonance */
				channel->midi_state = 4;
			else
				channel->midi_state = 0;
			break;
		default: /* Counting initial F0 bytes */
			switch (midi_byte) {
				case 0xF0:
					channel->midi_state++;
					break;
				case 0xFA:
				case 0xFC:
				case 0xFF:
					/* Reset filter parameters for all channels */
					{
						int i;
						for (i = 0; i < DUMB_IT_N_CHANNELS; i++) {
							sigrenderer->channel[i].filter_cutoff = 127;
							sigrenderer->channel[i].filter_resonance = 0;
							//// should we be resetting channel[i].playing->filter_* here?
						}
					}
					/* Fall through */
				default:
					channel->midi_state = 0;
					break;
			}
	}
}